

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O1

Bigint * mult(Bigint *a,Bigint *b)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Bigint *pBVar5;
  Bigint *pBVar6;
  uint32 *puVar7;
  uint32 *puVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  
  if (((a->x[0] == 0) && (a->wds == 1)) || ((b->x[0] == 0 && (b->wds == 1)))) {
    pBVar5 = (Bigint *)
             __ckd_malloc__(0x20,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/dtoa.c"
                            ,0x1a9);
    if (pBVar5 == (Bigint *)0x0) {
      pBVar5 = (Bigint *)0x0;
    }
    else {
      pBVar5->k = 0;
      pBVar5->maxwds = 1;
      pBVar5->sign = 0;
      pBVar5->wds = 0;
    }
    if (pBVar5 != (Bigint *)0x0) {
      pBVar5->wds = 1;
      pBVar5->x[0] = 0;
      return pBVar5;
    }
  }
  else {
    pBVar5 = a;
    if (a->wds < b->wds) {
      pBVar5 = b;
      b = a;
    }
    iVar2 = pBVar5->wds;
    iVar3 = b->wds;
    uVar13 = (long)iVar2 + (long)iVar3;
    iVar12 = (int)uVar13;
    pBVar6 = Balloc((uint)(pBVar5->maxwds < iVar12) + pBVar5->k);
    if (pBVar6 != (Bigint *)0x0) {
      puVar7 = pBVar6->x;
      if (0 < iVar12) {
        puVar8 = (uint32 *)&pBVar6->field_0x1c;
        if (&pBVar6->field_0x1c < pBVar6->x + uVar13) {
          puVar8 = pBVar6->x + uVar13;
        }
        memset(puVar7,0,((long)puVar8 + (-0x19 - (long)pBVar6) & 0xfffffffffffffffcU) + 4);
      }
      if (0 < iVar3) {
        puVar8 = b->x;
        do {
          uVar4 = *puVar8;
          if ((ulong)uVar4 != 0) {
            lVar9 = 0;
            uVar10 = 0;
            do {
              puVar1 = (uint *)((long)pBVar5->x + lVar9);
              uVar11 = *(uint *)((long)puVar7 + lVar9) + uVar10 + (ulong)*puVar1 * (ulong)uVar4;
              uVar10 = uVar11 >> 0x20;
              *(int *)((long)puVar7 + lVar9) = (int)uVar11;
              lVar9 = lVar9 + 4;
            } while (puVar1 + 1 < pBVar5->x + iVar2);
            *(int *)((long)puVar7 + lVar9) = (int)(uVar11 >> 0x20);
          }
          puVar8 = puVar8 + 1;
          puVar7 = puVar7 + 1;
        } while (puVar8 < b->x + iVar3);
      }
      if (0 < iVar12) {
        puVar7 = pBVar6->x + (uVar13 - 1);
        do {
          if (*puVar7 != 0) goto LAB_00113571;
          iVar2 = (int)uVar13;
          puVar7 = puVar7 + -1;
          uVar13 = (ulong)(iVar2 - 1);
        } while (1 < iVar2);
        uVar13 = 0;
      }
LAB_00113571:
      pBVar6->wds = (int)uVar13;
      return pBVar6;
    }
  }
  return (Bigint *)0x0;
}

Assistant:

static Bigint *
mult(Bigint *a, Bigint *b)
{
    Bigint *c;
    int k, wa, wb, wc;
    ULong *x, *xa, *xae, *xb, *xbe, *xc, *xc0;
    ULong y;
#ifdef ULLong
    ULLong carry, z;
#else
    ULong carry, z;
    ULong z2;
#endif

    if ((!a->x[0] && a->wds == 1) || (!b->x[0] && b->wds == 1)) {
        c = Balloc(0);
        if (c == NULL)
            return NULL;
        c->wds = 1;
        c->x[0] = 0;
        return c;
    }

    if (a->wds < b->wds) {
        c = a;
        a = b;
        b = c;
    }
    k = a->k;
    wa = a->wds;
    wb = b->wds;
    wc = wa + wb;
    if (wc > a->maxwds)
        k++;
    c = Balloc(k);
    if (c == NULL)
        return NULL;
    for(x = c->x, xa = x + wc; x < xa; x++)
        *x = 0;
    xa = a->x;
    xae = xa + wa;
    xb = b->x;
    xbe = xb + wb;
    xc0 = c->x;
#ifdef ULLong
    for(; xb < xbe; xc0++) {
        if ((y = *xb++)) {
            x = xa;
            xc = xc0;
            carry = 0;
            do {
                z = *x++ * (ULLong)y + *xc + carry;
                carry = z >> 32;
                *xc++ = (ULong)(z & FFFFFFFF);
            }
            while(x < xae);
            *xc = (ULong)carry;
        }
    }
#else
    for(; xb < xbe; xb++, xc0++) {
        if (y = *xb & 0xffff) {
            x = xa;
            xc = xc0;
            carry = 0;
            do {
                z = (*x & 0xffff) * y + (*xc & 0xffff) + carry;
                carry = z >> 16;
                z2 = (*x++ >> 16) * y + (*xc >> 16) + carry;
                carry = z2 >> 16;
                Storeinc(xc, z2, z);
            }
            while(x < xae);
            *xc = carry;
        }
        if (y = *xb >> 16) {
            x = xa;
            xc = xc0;
            carry = 0;
            z2 = *xc;
            do {
                z = (*x & 0xffff) * y + (*xc >> 16) + carry;
                carry = z >> 16;
                Storeinc(xc, z, z2);
                z2 = (*x++ >> 16) * y + (*xc & 0xffff) + carry;
                carry = z2 >> 16;
            }
            while(x < xae);
            *xc = z2;
        }
    }
#endif
    for(xc0 = c->x, xc = xc0 + wc; wc > 0 && !*--xc; --wc) ;
    c->wds = wc;
    return c;
}